

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::cbow
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  pointer piVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  ulong uVar5;
  int iVar6;
  vector<int,_std::allocator<int>_> bow;
  uniform_int_distribution<int> uniform;
  vector<int,_std::allocator<int>_> local_78;
  real local_54;
  FastText *local_50;
  uniform_int_distribution<int> local_48;
  State *local_40;
  minstd_rand *local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_12_ =
       ZEXT812(0);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_48._M_param._M_a = 1;
  if ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    local_38 = &state->rng;
    uVar5 = 0;
    local_54 = lr;
    local_50 = this;
    local_40 = state;
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()(&local_48,local_38,&local_48._M_param);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (-1 < rVar2) {
        iVar6 = 0;
        do {
          if ((rVar2 != iVar6) && (uVar3 = ((int)uVar5 - rVar2) + iVar6, -1 < (int)uVar3)) {
            piVar1 = (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)uVar3 <
                (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
              pvVar4 = Dictionary::getSubwords
                                 ((local_50->dict_).
                                  super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,piVar1[uVar3]);
              std::vector<int,std::allocator<int>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                        ((vector<int,std::allocator<int>> *)&local_78,
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
            }
          }
          iVar6 = iVar6 + 1;
        } while (rVar2 * 2 + 1 != iVar6);
      }
      Model::update((local_50->model_).
                    super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_78
                    ,line,(int)uVar5,local_54,local_40);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void FastText::cbow(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::vector<int32_t> bow;
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    bow.clear();
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w + c]);
        bow.insert(bow.end(), ngrams.cbegin(), ngrams.cend());
      }
    }
    model_->update(bow, line, w, lr, state);
  }
}